

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O0

bool __thiscall
HookStateStepIn::Start(HookStateStepIn *this,shared_ptr<Debugger> *debugger,lua_State *current)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  element_type *this_00;
  undefined1 local_498 [8];
  lua_Debug ar;
  shared_ptr<Debugger> local_38;
  lua_State *local_28;
  lua_State *current_local;
  shared_ptr<Debugger> *debugger_local;
  HookStateStepIn *this_local;
  
  local_28 = current;
  current_local = (lua_State *)debugger;
  debugger_local = (shared_ptr<Debugger> *)this;
  std::shared_ptr<Debugger>::shared_ptr(&local_38,debugger);
  bVar1 = StackLevelBasedState::Start(&this->super_StackLevelBasedState,&local_38,local_28);
  std::shared_ptr<Debugger>::~shared_ptr(&local_38);
  bVar1 = ((bVar1 ^ 0xffU) & 1) == 0;
  if (bVar1) {
    memset(local_498,0,0x450);
    (*lua_getstack)(local_28,0,(lua_Debug *)local_498);
    (*lua_getinfo)(local_28,"nSl",(lua_Debug *)local_498);
    pcVar3 = getDebugSource((lua_Debug *)local_498);
    std::__cxx11::string::operator=((string *)&this->file,pcVar3);
    iVar2 = getDebugCurrentLine((lua_Debug *)local_498);
    this->line = iVar2;
    this_00 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         debugger);
    Debugger::ExitDebugMode(this_00);
  }
  return bVar1;
}

Assistant:

bool HookStateStepIn::Start(std::shared_ptr<Debugger> debugger, lua_State* current)
{
	if (!StackLevelBasedState::Start(debugger, current))
		return false;
	lua_Debug ar{};
	lua_getstack(current, 0, &ar);
	lua_getinfo(current, "nSl", &ar);
	file = getDebugSource(&ar);
	line = getDebugCurrentLine(&ar);
	debugger->ExitDebugMode();
	return true;
}